

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O3

void __thiscall
pstore::error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>::~error_or
          (error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_> *this)

{
  thread *ptVar1;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *puVar2;
  
  if (this->has_error_ != false) {
    error_or<std::unique_ptr<std::thread,std::default_delete<std::thread>>>::
    error_storage_impl<pstore::error_or<std::unique_ptr<std::thread,std::default_delete<std::thread>>>&,std::error_code>
              (this);
    return;
  }
  puVar2 = error_or<std::unique_ptr<std::thread,std::default_delete<std::thread>>>::
           value_storage_impl<pstore::error_or<std::unique_ptr<std::thread,std::default_delete<std::thread>>>&,std::unique_ptr<std::thread,std::default_delete<std::thread>>>
                     (this);
  ptVar1 = (puVar2->_M_t).super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t
           .super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar1 != (thread *)0x0) {
    if ((ptVar1->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar1,8);
  }
  (puVar2->_M_t).super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  return;
}

Assistant:

error_or<T>::~error_or () {
        if (!has_error_) {
            get_storage ()->~storage_type ();
        } else {
            using error_code = std::error_code;
            get_error_storage ()->~error_code ();
        }
    }